

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_property.cpp
# Opt level: O0

void tst_bounded_property(void)

{
  bool bVar1;
  float *pfVar2;
  ostream *poVar3;
  socklen_t __len;
  sockaddr *__addr;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float local_188;
  float local_184;
  float local_180;
  float local_17c;
  float local_178;
  float local_174;
  anon_class_8_1_4f9d58bb local_170;
  function<void_()> local_168;
  float local_144;
  bool local_13d;
  float local_13c;
  float fStack_138;
  bool called;
  float local_134;
  float local_130;
  float local_12c;
  float local_128;
  float local_124;
  float local_120;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  undefined1 local_f8 [8];
  BoundedProperty<float> v;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  undefined1 local_b8 [8];
  BoundedProperty<float> float_valid;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  undefined1 local_78 [8];
  BoundedProperty<float> float_over;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  undefined1 local_30 [8];
  BoundedProperty<float> float_under;
  
  local_34 = 0.0;
  local_38 = 1.0;
  local_3c = -2.0;
  rengine::BoundedProperty<float>::BoundedProperty
            ((BoundedProperty<float> *)local_30,&local_34,&local_38,&local_3c);
  local_40 = 0.0;
  bVar1 = rengine::Property<float>::operator==((Property<float> *)local_30,&local_40);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    pfVar2 = rengine::Property::operator_cast_to_float_((Property *)local_30);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar2);
    poVar3 = std::operator<<(poVar3,"\' vs \'");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0.0);
    poVar3 = std::operator<<(poVar3,"\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    float_over.m_min = 0.0;
    bVar1 = rengine::Property<float>::operator==((Property<float> *)local_30,&float_over.m_min);
    if (!bVar1) {
      __assert_fail("(float_under) == (0.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x2c,"void tst_bounded_property()");
    }
  }
  local_7c = 0.0;
  local_80 = 1.0;
  local_84 = 2.0;
  rengine::BoundedProperty<float>::BoundedProperty
            ((BoundedProperty<float> *)local_78,&local_7c,&local_80,&local_84);
  local_88 = 1.0;
  bVar1 = rengine::Property<float>::operator==((Property<float> *)local_78,&local_88);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    pfVar2 = rengine::Property::operator_cast_to_float_((Property *)local_78);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar2);
    poVar3 = std::operator<<(poVar3,"\' vs \'");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1.0);
    poVar3 = std::operator<<(poVar3,"\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    float_valid.m_max = 1.0;
    bVar1 = rengine::Property<float>::operator==((Property<float> *)local_78,&float_valid.m_max);
    if (!bVar1) {
      __assert_fail("(float_over) == (1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x2f,"void tst_bounded_property()");
    }
  }
  local_bc = 0.0;
  local_c0 = 1.0;
  local_c4 = 0.5;
  rengine::BoundedProperty<float>::BoundedProperty
            ((BoundedProperty<float> *)local_b8,&local_bc,&local_c0,&local_c4);
  local_c8 = 0.5;
  bVar1 = rengine::Property<float>::operator==((Property<float> *)local_b8,&local_c8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    pfVar2 = rengine::Property::operator_cast_to_float_((Property *)local_b8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar2);
    poVar3 = std::operator<<(poVar3,"\' vs \'");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0.5);
    poVar3 = std::operator<<(poVar3,"\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    v.m_max = 0.5;
    bVar1 = rengine::Property<float>::operator==((Property<float> *)local_b8,&v.m_max);
    if (!bVar1) {
      __assert_fail("(float_valid) == (0.5f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x32,"void tst_bounded_property()");
    }
  }
  local_fc = 0.0;
  local_100 = 1.0;
  local_104 = 0.0;
  pfVar2 = &local_104;
  rengine::BoundedProperty<float>::BoundedProperty
            ((BoundedProperty<float> *)local_f8,&local_fc,&local_100,pfVar2);
  __len = (socklen_t)pfVar2;
  local_108 = 0.0;
  bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_108);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    pfVar2 = rengine::Property::operator_cast_to_float_((Property *)local_f8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar2);
    poVar3 = std::operator<<(poVar3,"\' vs \'");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0.0);
    poVar3 = std::operator<<(poVar3,"\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_10c = 0.0;
    bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_10c);
    if (!bVar1) {
      __assert_fail("(v) == (0.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x35,"void tst_bounded_property()");
    }
  }
  local_110 = 10.0;
  rengine::BoundedProperty<float>::set((BoundedProperty<float> *)local_f8,&local_110);
  local_114 = 1.0;
  bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_114);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    pfVar2 = rengine::Property::operator_cast_to_float_((Property *)local_f8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar2);
    poVar3 = std::operator<<(poVar3,"\' vs \'");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1.0);
    poVar3 = std::operator<<(poVar3,"\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_118 = 1.0;
    bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_118);
    if (!bVar1) {
      __assert_fail("(v) == (1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x39,"void tst_bounded_property()");
    }
  }
  local_11c = 10.0;
  rengine::BoundedProperty<float>::operator=((BoundedProperty<float> *)local_f8,&local_11c);
  local_120 = 1.0;
  bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_120);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    pfVar2 = rengine::Property::operator_cast_to_float_((Property *)local_f8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar2);
    poVar3 = std::operator<<(poVar3,"\' vs \'");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1.0);
    poVar3 = std::operator<<(poVar3,"\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_124 = 1.0;
    bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_124);
    if (!bVar1) {
      __assert_fail("(v) == (1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x3b,"void tst_bounded_property()");
    }
  }
  local_128 = -10.0;
  rengine::BoundedProperty<float>::set((BoundedProperty<float> *)local_f8,&local_128);
  local_12c = 0.0;
  bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_12c);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    pfVar2 = rengine::Property::operator_cast_to_float_((Property *)local_f8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar2);
    poVar3 = std::operator<<(poVar3,"\' vs \'");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0.0);
    poVar3 = std::operator<<(poVar3,"\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_130 = 0.0;
    bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_130);
    if (!bVar1) {
      __assert_fail("(v) == (0.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x3d,"void tst_bounded_property()");
    }
  }
  local_134 = -10.0;
  rengine::BoundedProperty<float>::operator=((BoundedProperty<float> *)local_f8,&local_134);
  fStack_138 = 0.0;
  bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&stack0xfffffffffffffec8)
  ;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    pfVar2 = rengine::Property::operator_cast_to_float_((Property *)local_f8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar2);
    poVar3 = std::operator<<(poVar3,"\' vs \'");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0.0);
    poVar3 = std::operator<<(poVar3,"\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_13c = 0.0;
    bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_13c);
    if (!bVar1) {
      __assert_fail("(v) == (0.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x3f,"void tst_bounded_property()");
    }
  }
  local_13d = false;
  local_144 = 0.0;
  rengine::BoundedProperty<float>::operator=((BoundedProperty<float> *)local_f8,&local_144);
  local_170.called = &local_13d;
  std::function<void()>::function<tst_bounded_property()::__0,void>
            ((function<void()> *)&local_168,&local_170);
  rengine::Property<float>::connect((Property<float> *)local_f8,(int)&local_168,__addr,__len);
  std::function<void_()>::~function(&local_168);
  local_174 = 0.5;
  rengine::BoundedProperty<float>::operator=((BoundedProperty<float> *)local_f8,&local_174);
  local_178 = 0.5;
  bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_178);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    pfVar2 = rengine::Property::operator_cast_to_float_((Property *)local_f8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar2);
    poVar3 = std::operator<<(poVar3,"\' vs \'");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0.5);
    poVar3 = std::operator<<(poVar3,"\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_17c = 0.5;
    bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_17c);
    if (!bVar1) {
      __assert_fail("(v) == (0.5f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x47,"void tst_bounded_property()");
    }
  }
  if (((local_13d & 1U) == 0) && ((local_13d & 1U) == 0)) {
    __assert_fail("called",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                  ,0x48,"void tst_bounded_property()");
  }
  local_13d = false;
  local_180 = -1.0;
  rengine::BoundedProperty<float>::operator=((BoundedProperty<float> *)local_f8,&local_180);
  local_184 = 0.0;
  bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_184);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    pfVar2 = rengine::Property::operator_cast_to_float_((Property *)local_f8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar2);
    poVar3 = std::operator<<(poVar3,"\' vs \'");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0.0);
    poVar3 = std::operator<<(poVar3,"\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_188 = 0.0;
    bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_188);
    if (!bVar1) {
      __assert_fail("(v) == (0.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x4c,"void tst_bounded_property()");
    }
  }
  if (((local_13d & 1U) == 0) && ((local_13d & 1U) == 0)) {
    __assert_fail("called",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                  ,0x4d,"void tst_bounded_property()");
  }
  local_13d = false;
  local_18c = -2.0;
  rengine::BoundedProperty<float>::operator=((BoundedProperty<float> *)local_f8,&local_18c);
  local_190 = 0.0;
  bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_190);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    pfVar2 = rengine::Property::operator_cast_to_float_((Property *)local_f8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar2);
    poVar3 = std::operator<<(poVar3,"\' vs \'");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0.0);
    poVar3 = std::operator<<(poVar3,"\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_194 = 0.0;
    bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_194);
    if (!bVar1) {
      __assert_fail("(v) == (0.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x51,"void tst_bounded_property()");
    }
  }
  if (((local_13d & 1U) != 0) && (((local_13d ^ 0xffU) & 1) == 0)) {
    __assert_fail("!called",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                  ,0x52,"void tst_bounded_property()");
  }
  local_13d = false;
  local_198 = 10.0;
  rengine::BoundedProperty<float>::operator=((BoundedProperty<float> *)local_f8,&local_198);
  local_19c = 1.0;
  bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_19c);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    pfVar2 = rengine::Property::operator_cast_to_float_((Property *)local_f8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar2);
    poVar3 = std::operator<<(poVar3,"\' vs \'");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1.0);
    poVar3 = std::operator<<(poVar3,"\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_1a0 = 1.0;
    bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_1a0);
    if (!bVar1) {
      __assert_fail("(v) == (1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x56,"void tst_bounded_property()");
    }
  }
  if (((local_13d & 1U) == 0) && ((local_13d & 1U) == 0)) {
    __assert_fail("called",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                  ,0x57,"void tst_bounded_property()");
  }
  local_13d = false;
  local_1a4 = 100.0;
  rengine::BoundedProperty<float>::operator=((BoundedProperty<float> *)local_f8,&local_1a4);
  local_1a8 = 1.0;
  bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_1a8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    pfVar2 = rengine::Property::operator_cast_to_float_((Property *)local_f8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar2);
    poVar3 = std::operator<<(poVar3,"\' vs \'");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1.0);
    poVar3 = std::operator<<(poVar3,"\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_1ac = 1.0;
    bVar1 = rengine::Property<float>::operator==((Property<float> *)local_f8,&local_1ac);
    if (!bVar1) {
      __assert_fail("(v) == (1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x5b,"void tst_bounded_property()");
    }
  }
  if (((local_13d & 1U) != 0) && (((local_13d ^ 0xffU) & 1) == 0)) {
    __assert_fail("!called",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                  ,0x5c,"void tst_bounded_property()");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"void tst_bounded_property()");
  poVar3 = std::operator<<(poVar3,": ok");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  rengine::BoundedProperty<float>::~BoundedProperty((BoundedProperty<float> *)local_f8);
  rengine::BoundedProperty<float>::~BoundedProperty((BoundedProperty<float> *)local_b8);
  rengine::BoundedProperty<float>::~BoundedProperty((BoundedProperty<float> *)local_78);
  rengine::BoundedProperty<float>::~BoundedProperty((BoundedProperty<float> *)local_30);
  return;
}

Assistant:

void tst_bounded_property()
{
    BoundedProperty<float> float_under { 0.0f, 1.0f, -2.0f };
    check_equal(float_under, 0.0f);

    BoundedProperty<float> float_over { 0.0f, 1.0f, 2.0f };
    check_equal(float_over, 1.0f)

    BoundedProperty<float> float_valid { 0.0f, 1.0f, 0.5f };
    check_equal(float_valid, 0.5f);

    BoundedProperty<float> v(0.0f, 1.0f);
    check_equal(v, 0.0f);

    // Check setters
    v.set(10.0f);
    check_equal(v, 1.0f);
    v = 10.0f;
    check_equal(v, 1.0f);
    v.set(-10.0f);
    check_equal(v, 0.0f);
    v = -10.0f;
    check_equal(v, 0.0f);

    // Check that notifiers are called only when inside range
    bool called = false;
    v = 0.0f;
    v.connect([&]() { called = true; });

    v = 0.5f;
    check_equal(v, 0.5f);
    check_true(called);

    called = false;
    v = -1.0f;
    check_equal(v, 0.0f);
    check_true(called);

    called = false;
    v = -2.0f;
    check_equal(v, 0.0f);
    check_true(!called);

    called = false;
    v = 10.0f;
    check_equal(v, 1.0f);
    check_true(called);

    called = false;
    v = 100.0f;
    check_equal(v, 1.0f);
    check_true(!called);

    cout << __PRETTY_FUNCTION__ << ": ok" << endl;
}